

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdi.cpp
# Opt level: O0

bool ReadFDI(MemFile *file,shared_ptr<Disk> *disk)

{
  allocator<unsigned_char> *this;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong extraout_RAX;
  ulong uVar9;
  exception *peVar10;
  size_type sVar11;
  uchar *puVar12;
  element_type *peVar13;
  char *pcVar14;
  mapped_type *this_00;
  size_t in_RCX;
  size_t __nbytes;
  bool local_2e2;
  int local_29c;
  allocator<char> local_1f1;
  key_type local_1f0;
  byte local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator local_181;
  string local_180 [8];
  string str;
  undefined1 local_158 [8];
  vector<char,_std::allocator<char>_> comment;
  int len;
  int desc_pos;
  char *local_130;
  value_type local_124;
  value_type local_123;
  CRC16 local_122;
  int local_120;
  CRC16 crc;
  int ssize;
  uint8_t size;
  Data data;
  int sector_size;
  int iStack_f0;
  uint8_t b1793Size;
  int sector_pos;
  int old_pos;
  uint8_t dam;
  bool bad_data;
  bool no_data;
  bool deleted_data;
  undefined1 local_d8 [8];
  Sector sector;
  byte local_90;
  byte local_8f;
  ushort local_8e;
  int iStack_8c;
  FDI_SECTOR fs;
  int i;
  int track_pos;
  byte local_77;
  byte local_76;
  byte local_75;
  byte local_71;
  undefined1 local_70;
  FDI_TRACK ft;
  Track track;
  CylHead cylhead;
  int head;
  int cyl;
  int header_pos;
  int data_pos;
  int heads;
  int cyls;
  byte local_28;
  FDI_HEADER fh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  fh._6_8_ = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_RAX & 1) == 0) ||
     (uVar9 = MemFile::read(file,(int)&heads + 2,(void *)0xe,in_RCX), (uVar9 & 1) == 0)) {
    file_local._7_1_ = false;
  }
  else {
    iVar5 = memcmp((void *)((long)&heads + 2),"FDI",3);
    if (iVar5 == 0) {
      Format::Validate((uint)cyls._2_1_,(uint)local_28,1,0x200,0);
      uVar6 = (uint)(ushort)fh._2_2_;
      __nbytes = (size_t)fh.bTracks[0];
      MemFile::seek(file,(ushort)fh.bTracks + 0xe);
      for (cylhead.head = 0; cylhead.head < (int)(uint)cyls._2_1_; cylhead.head = cylhead.head + 1)
      {
        for (cylhead.cyl = 0; cylhead.cyl < (int)(uint)local_28; cylhead.cyl = cylhead.cyl + 1) {
          CylHead::CylHead((CylHead *)
                           &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,cylhead.head,
                           cylhead.cyl);
          Track::Track((Track *)&local_70,0);
          uVar9 = MemFile::read(file,(int)&local_77,(void *)0x7,__nbytes);
          if ((uVar9 & 1) == 0) {
            peVar10 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[20],CylHead&>
                      (peVar10,(char (*) [20])"short file reading ",
                       (CylHead *)
                       &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(peVar10,&util::exception::typeinfo,util::exception::~exception);
          }
          if (0x90 < local_71) {
            peVar10 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
                      (peVar10,(CylHead *)
                               &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (char (*) [24])" has too many sectors (",&local_71,(char (*) [2])0x2a8e34);
            __cxa_throw(peVar10,&util::exception::typeinfo,util::exception::~exception);
          }
          fs._3_4_ = uVar6 + ((uint)local_75 << 0x10 | (uint)local_76 << 8 | (uint)local_77);
          for (iStack_8c = 0; __nbytes = (size_t)local_71, iStack_8c < (int)(uint)local_71;
              iStack_8c = iStack_8c + 1) {
            uVar9 = MemFile::read(file,(int)&sector + 0x3d,(void *)0x7,__nbytes);
            if ((uVar9 & 1) == 0) {
              peVar10 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
                        (peVar10,(char (*) [20])"short file reading ",
                         (CylHead *)
                         &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (char (*) [15])" sector index ",&stack0xffffffffffffff74);
              __cxa_throw(peVar10,&util::exception::typeinfo,util::exception::~exception);
            }
            Header::Header((Header *)&old_pos,
                           (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_,
                           (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_,
                           (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                           (uint)local_90);
            Sector::Sector((Sector *)local_d8,_250K,MFM,(Header *)&old_pos,0);
            sector_pos._3_1_ = -((char)local_8f >> 7);
            sector_pos._2_1_ = (byte)((local_8f & 0x40) >> 6);
            sector_pos._1_1_ = 1;
            sector_pos._0_1_ = (sector_pos._3_1_ == '\0') * '\x03' - 8;
            iStack_f0 = MemFile::tell(file);
            sector_size = fs._3_4_ + (uint)local_8e;
            bVar2 = MemFile::seek(file,sector_size);
            if (!bVar2) {
              peVar10 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::
              exception<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
                        (peVar10,(char (*) [19])"failed to seek to ",
                         (CylHead *)
                         &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [9])0x2ab23d,
                         (uchar *)((long)&sector.m_data.
                                          super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 7),
                         (char (*) [8])" data @",&sector_size);
              __cxa_throw(peVar10,&util::exception::typeinfo,util::exception::~exception);
            }
            bVar3 = local_90 & 3;
            data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = Sector::SizeCodeToLength((uint)bVar3);
            sVar11 = (size_type)
                     data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
            this = (allocator<unsigned_char> *)((long)&crc.m_crc + 1);
            std::allocator<unsigned_char>::allocator(this);
            Data::vector((Data *)&ssize,sVar11,this);
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)((long)&crc.m_crc + 1));
            puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ssize);
            uVar7 = Data::size((Data *)&ssize);
            MemFile::read(file,(int)puVar12,(void *)0x1,(ulong)uVar7);
            MemFile::seek(file,iStack_f0);
            for (crc.m_crc._0_1_ = 0; (sector_pos._2_1_ & 1) == 0 && (byte)crc.m_crc < 4;
                crc.m_crc._0_1_ = (byte)crc.m_crc + 1) {
              iVar5 = Sector::SizeCodeToLength((uint)(byte)crc.m_crc);
              local_120 = iVar5;
              iVar8 = Sector::SizeCodeToLength((uint)local_90);
              if (iVar5 == iVar8) {
                if (((uint)local_8f & 1 << ((byte)crc.m_crc & 0x1f)) != 0) {
                  sector_pos._1_1_ = 0;
                }
LAB_0027375b:
                local_8f = local_8f & ((byte)(1 << ((byte)crc.m_crc & 0x1f)) ^ 0xff);
              }
              else if ((byte)crc.m_crc <= bVar3) {
                CRC16::CRC16(&local_122,0xcdb4);
                CRC16::add(&local_122,(uint)(byte)sector_pos);
                puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ssize
                                    );
                CRC16::add(&local_122,puVar12,(long)local_120);
                if ((byte)crc.m_crc == bVar3) {
                  if (((uint)local_8f & 1 << ((byte)crc.m_crc & 0x1f)) != 0) {
                    uVar4 = CRC16::operator_cast_to_unsigned_short(&local_122);
                    local_123 = (value_type)(uVar4 >> 8);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ssize,
                               &local_123);
                    uVar4 = CRC16::operator_cast_to_unsigned_short(&local_122);
                    local_124 = (value_type)uVar4;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ssize,
                               &local_124);
                  }
                }
                else {
                  puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &ssize);
                  CRC16::add(&local_122,puVar12 + local_120,2);
                  bVar1 = local_8f >> ((byte)crc.m_crc & 0x1f);
                  uVar4 = CRC16::operator_cast_to_unsigned_short(&local_122);
                  if (((bVar1 & 1) != 0) != (uVar4 == 0)) {
                    local_130 = CHR(cylhead.head,cylhead.cyl,
                                    (uint)sector.m_data.
                                          super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage._7_1_);
                    Message<int&,char_const*>
                              (msgWarning,"inconsistent CRC flag for size=%d for %s",
                               (int *)((long)&data.
                                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              .
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ),&local_130);
                  }
                }
                goto LAB_0027375b;
              }
            }
            if ((local_8f & 0x3f) != 0) {
              _len = CHSR(cylhead.head,cylhead.cyl,iStack_8c,
                          (uint)sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
              Message<unsigned_char&,char_const*>
                        (msgWarning,"unexpected flags (%02X) on %s",&local_8f,(char **)&len);
            }
            Sector::add((Sector *)local_d8,(Data *)&ssize,(bool)(sector_pos._1_1_ & 1),
                        (byte)sector_pos);
            Track::add((Track *)&local_70,(Sector *)local_d8);
            Data::~Data((Data *)&ssize);
            Sector::~Sector((Sector *)local_d8);
          }
          peVar13 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)fh._6_8_);
          Disk::write(peVar13,(int)&track + 0x18,&local_70,__nbytes);
          Track::~Track((Track *)&local_70);
        }
      }
      comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
           ZEXT24((ushort)fh.abSignature._0_2_);
      if ((comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0) &&
         (bVar2 = MemFile::seek(file,comment.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                     ._20_4_), bVar2)) {
        if ((int)comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < (int)uVar6
           ) {
          local_29c = uVar6 - comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_
          ;
        }
        else {
          local_29c = 0x100;
        }
        comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = local_29c;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_158,(long)local_29c,
                   (allocator_type *)(str.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
        bVar2 = MemFile::read<std::vector<char,std::allocator<char>>>
                          (file,(vector<char,_std::allocator<char>_> *)local_158);
        if (!bVar2) {
          peVar10 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[27]>
                    (peVar10,(char (*) [27])"short file reading comment");
          __cxa_throw(peVar10,&util::exception::typeinfo,util::exception::~exception);
        }
        pcVar14 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)local_158);
        sVar11 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_158);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,pcVar14,sVar11,&local_181);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        local_1c9 = 0;
        std::__cxx11::string::substr((ulong)&local_1a8,(ulong)local_180);
        bVar2 = std::operator!=(&local_1a8,"\r\n\'This file created by TDCVT");
        local_2e2 = false;
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&local_1c8,(ulong)local_180);
          local_1c9 = 1;
          local_2e2 = std::operator!=(&local_1c8,"FDI");
        }
        if ((local_1c9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&local_1a8);
        if (local_2e2 != false) {
          peVar13 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)fh._6_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"comment",&local_1f1);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&peVar13->metadata,&local_1f0);
          std::__cxx11::string::operator=((string *)this_00,local_180);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator(&local_1f1);
        }
        std::__cxx11::string::~string(local_180);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_158);
      }
      peVar13 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           fh._6_8_);
      std::__cxx11::string::operator=((string *)&peVar13->strType,"FDI");
      file_local._7_1_ = true;
    }
    else {
      file_local._7_1_ = false;
    }
  }
  return file_local._7_1_;
}

Assistant:

bool ReadFDI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    FDI_HEADER fh;
    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;
    else if (memcmp(fh.abSignature, FDI_SIGNATURE, sizeof(fh.abSignature)))
        return false;

    int cyls = fh.bTracks[0];
    int heads = fh.bSides[0];
    Format::Validate(cyls, heads);

    auto data_pos = (fh.bDataOffset[1] << 8) | fh.bDataOffset[0];
    auto header_pos = static_cast<int>(sizeof(FDI_HEADER)) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);
    file.seek(header_pos);

    //  uint8_t* pbData = pb + fh.bDataOffset[0];
    //  auto pbHeaders = (uint8_t*)&fh.bExtraSize + sizeof(fh.bExtraSize) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            Track track;

            FDI_TRACK ft;
            if (!file.read(&ft, sizeof(ft)))
                throw util::exception("short file reading ", cylhead);

            if (ft.sectors > MAX_SECTORS)
                throw util::exception(cylhead, " has too many sectors (", ft.sectors, ")");

            auto track_pos = data_pos + (/*(ft.abTrackOffset[3] << 24) |*/ (ft.abTrackOffset[2] << 16) |
                (ft.abTrackOffset[1] << 8) | ft.abTrackOffset[0]);

            for (int i = 0; i < ft.sectors; ++i)
            {
                FDI_SECTOR fs;
                if (!file.read(&fs, sizeof(fs)))
                    throw util::exception("short file reading ", cylhead, " sector index ", i);

                Sector sector(DataRate::_250K, Encoding::MFM, Header(fs.bTrack, fs.bSide, fs.bSector, fs.bSize));

                bool deleted_data = (fs.bFlags & 0x80) != 0;
                bool no_data = (fs.bFlags & 0x40) != 0;
                bool bad_data = true;   // until we learn otherwise
                uint8_t dam = deleted_data ? 0xf8 : 0xfb;

                auto old_pos = file.tell();
                auto sector_pos = track_pos + ((fs.bSectorOffset[1] << 8) | fs.bSectorOffset[0]);
                if (!file.seek(sector_pos))
                    throw util::exception("failed to seek to ", cylhead, " sector ", fs.bSector, " data @", sector_pos);

                // Use only 2 bits of the size, to match FD1793 behaviour
                uint8_t b1793Size = fs.bSize & 3;
                auto sector_size = Sector::SizeCodeToLength(b1793Size);

                Data data(sector_size); // always allocate full PC size, plus room for CRC
                file.read(data.data(), 1, static_cast<int>(data.size()));
                file.seek(old_pos);

                // Loop through valid size codes to check the flag bits
                for (uint8_t size = 0; !no_data && size <= 3; ++size)
                {
                    auto ssize = Sector::SizeCodeToLength(size);

                    // Does the size match the PC treatment of the size code?
                    if (ssize == Sector::SizeCodeToLength(fs.bSize))
                    {
                        // If the flags say no error, clear the data CRC error
                        if (fs.bFlags & (1 << size))
                            bad_data = false;
                    }
                    // Or is it within the current FD1793 size?
                    else if (size <= b1793Size)
                    {
                        CRC16 crc(CRC16::A1A1A1);
                        crc.add(dam);
                        crc.add(data.data(), ssize);

                        // If the size matches, there are no CRC bytes in the data
                        if (size == b1793Size)
                        {
                            // Do the flags indicate the CRC is good?
                            if (fs.bFlags & (1 << size))
                            {
                                // Add the calculated CRC bytes to to preserve the status
                                data.push_back(crc >> 8);
                                data.push_back(crc & 0xff);
                            }
                        }
                        else
                        {
                            // Continue reading into the data to check the CRC
                            crc.add(data.data() + ssize, 2);

                            // Ensure the CRC status matches the flags
                            if (!!(fs.bFlags & (1 << size)) != (crc ? 0 : 1))
                                Message(msgWarning, "inconsistent CRC flag for size=%d for %s", sector_size, CHR(cyl, head, fs.bSector));
                        }
                    }
                    else
                    {
                        // Skip clearing the flag so we warn any set bit below
                        continue;
                    }

                    // Reset the bit for this size, whether or not we used it
                    fs.bFlags &= ~(1 << size);
                }

                // Warn about any remaining flags, in case we're missing something
                if (fs.bFlags & ~0xc0)
                    Message(msgWarning, "unexpected flags (%02X) on %s", fs.bFlags, CHSR(cyl, head, i, fs.bSector));

                sector.add(std::move(data), bad_data, dam);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    auto desc_pos = (fh.bDescOffset[1] << 8) | fh.bDescOffset[0];
    if (desc_pos && file.seek(desc_pos))
    {
        // Read the comment block
        auto len = (data_pos > desc_pos) ? (data_pos - desc_pos) : 256;
        std::vector<char> comment(len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        std::string str = std::string(comment.data(), comment.size());

        // To avoid confusion, don't store the default TDCVT comment
        if (str.substr(0, 29) != "\r\n'This file created by TDCVT" && str.substr(0, 3) != "FDI")
            disk->metadata["comment"] = str;
    }

    disk->strType = "FDI";
    return true;
}